

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

X * __thiscall IMLE::predict(IMLE *this,Z *z)

{
  ArrayX *this_00;
  ArrayX *this_01;
  Mat *this_02;
  double dVar1;
  pointer pdVar2;
  pointer pFVar3;
  pointer piVar4;
  int j;
  long lVar5;
  long lVar6;
  PointerType pdVar7;
  Scal SVar8;
  Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
  local_e0;
  X sumInvRj;
  value_type local_50;
  X sumInvRxj;
  
  this_00 = &this->predictions;
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::clear(this_00);
  this_01 = &this->predictionsVar;
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::clear(this_01);
  pdVar2 = (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  if ((z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      (long)this->d) {
    pdVar7 = (PointerType)0x0;
    lVar5 = 0;
    for (lVar6 = 0; lVar6 < this->M; lVar6 = lVar6 + 1) {
      SVar8 = LinearExpert::queryZ
                        ((LinearExpert *)
                         ((long)&(((this->experts).
                                   super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                   .
                                   super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).d
                         + lVar5),z);
      pdVar7 = (PointerType)((double)pdVar7 + SVar8);
      lVar5 = lVar5 + 0x308;
    }
    local_e0.m_lhs.m_diagonal.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
         pdVar7;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              (&(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,1,
               (Scalar *)&local_e0);
    sumInvRj.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)
         ((double)local_e0.m_lhs.m_diagonal.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                  .m_data + this->pNoiseModelZ);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              (&(this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,1,
               (Scalar *)&sumInvRj);
    this->sumAll = *(this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_e0,"IMLE::predict: query dimension does not match input dimension!!"
               ,(allocator *)&sumInvRj);
    message(this,(string *)&local_e0);
    std::__cxx11::string::_M_dispose();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,1);
  }
  dVar1 = *(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)this->M);
    this_02 = &this->fInvRj;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&this_02->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
               (long)this->D,(long)this->M);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&(this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
               (long)this->D,(long)this->M);
    lVar6 = 0x168;
    for (lVar5 = 0; lVar5 < this->M; lVar5 = lVar5 + 1) {
      pFVar3 = (this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               .
               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sumInvRj.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)((long)pFVar3 + lVar6 + -0x100);
      (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data[lVar5] =
           *(double *)((long)&(pFVar3->super_LinearExpert).Mu + lVar6 + 8U) *
           *(double *)((long)pFVar3 + lVar6 + -0x30) +
           *(this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
      sumInvRj.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           *(Index *)((long)pFVar3 + lVar6 + -0xf8);
      local_e0.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
      local_e0.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data + local_e0.m_lhs.m_diagonal.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                     .m_rows.m_value * lVar5;
      local_e0.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_e0.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           this_02;
      local_e0.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = lVar5;
      local_e0.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride =
           local_e0.m_lhs.m_diagonal.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_rows.m_value;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_e0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&sumInvRj);
      local_e0.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
      local_e0.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data + local_e0.m_lhs.m_diagonal.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                     .m_rows.m_value * lVar5;
      local_e0.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = 0;
      local_e0.m_rhs =
           (RhsNested)
           ((long)&(((this->experts).
                     super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     .
                     super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).d + lVar6);
      sumInvRj.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_rows;
      sumInvRj.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data + sumInvRj.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows * lVar5;
      local_e0.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           this_02;
      local_e0.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = lVar5;
      local_e0.m_lhs.m_diagonal.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride =
           local_e0.m_lhs.m_diagonal.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_rows.m_value;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>,Eigen::Matrix<double,_1,1,0,_1,1>,1>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&sumInvRj,&local_e0
                );
      lVar6 = lVar6 + 0x308;
    }
    local_e0.m_lhs.m_diagonal.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
         (PointerType)this_02;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&sumInvRj,
               (DenseBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
                *)&local_e0);
    local_e0.m_lhs.m_diagonal.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
         (PointerType)&this->invRxj;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&sumInvRxj,
               (DenseBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
                *)&local_e0);
    local_e0.m_lhs.m_diagonal.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
         (PointerType)&sumInvRxj;
    local_e0.m_lhs.m_diagonal.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
    m_value = (long)&sumInvRj;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_50,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_e0);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(this_00,&local_50);
    free(local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)&sumInvRj;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e0,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_50);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(this_01,(value_type *)&local_e0);
    free(local_e0.m_lhs.m_diagonal.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
         m_data);
    local_e0.m_lhs.m_diagonal.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
         (PointerType)
         (*(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data / this->sumAll);
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->predictionsWeight,(value_type *)&local_e0);
    free(sumInvRxj.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(sumInvRj.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              (&(this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)this->M,&this->pNoiseModelZ);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
              (&(this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
               (long)this->D,(long)this->M);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
              (&(this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
               (long)this->D,(long)this->M);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(this_00,&this->zeroX);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(this_01,&this->infinityX);
    local_e0.m_lhs.m_diagonal.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
         (PointerType)0x0;
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->predictionsWeight,(value_type *)&local_e0);
  }
  this->nSolFound = 1;
  piVar4 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar4) {
    (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->sNearest,(long)this->M,0);
  this->solIdx = 0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&this->zQuery,z);
  this->hasPredJacobian = false;
  this->hasPredErrorReductionDrvt = false;
  return (this->predictions).
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start + this->solIdx;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::X const &IMLE_base::predict(Z const &z)
{

    // Clear predict data structure
    predictions.clear();
    predictionsVar.clear();
    predictionsWeight.clear();

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( z.size() != d )
    {
        message("IMLE::predict: query dimension does not match input dimension!!");

        sum_p_z.setZero(1);
    }
    else
#endif
    {
        Scal sum_p = 0.0;
        for(int j = 0; j < M; j++)
            sum_p += experts[j].queryZ(z);
        sum_p_z.setConstant(1, sum_p);
        sumW.setConstant(1, sum_p + pNoiseModelZ);
        sumAll = sumW(0);
    }

    if(sum_p_z(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        varPhiAuxj.setConstant(M,pNoiseModelZ);
        fInvRj.setZero(D,M);
        invRxj.setZero(D,M);

        predictions.push_back(zeroX);
        predictionsVar.push_back(infinityX);
        predictionsWeight.push_back(0.0);
    }
    else
    {
        varPhiAuxj.resize(M);
        fInvRj.resize(D,M);
        invRxj.resize(D,M);
        for(int j = 0; j < M; j++)
        {
            varPhiAuxj(j) = experts[j].getGamma() * experts[j].get_p_z() + sumW(0);
            fInvRj.col(j) = experts[j].getPredXInvVar() * (experts[j].get_p_z() / varPhiAuxj(j));
            invRxj.col(j) = fInvRj.col(j).asDiagonal() * experts[j].getPredX();
        }

        // Update storage results
        X sumInvRj = fInvRj.rowwise().sum();
        X sumInvRxj = invRxj.rowwise().sum();

        predictions.push_back( sumInvRxj.cwiseQuotient(sumInvRj) );
        predictionsVar.push_back( sumInvRj.cwiseInverse() );
        predictionsWeight.push_back( sum_p_z(0) / sumAll );
    }

    nSolFound = 1;
    sNearest.clear();
    sNearest.resize(M,0);

    solIdx = 0;

    zQuery = z;
    hasPredJacobian = false;
    hasPredErrorReductionDrvt = false;

    return predictions[solIdx];
}